

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.h
# Opt level: O0

unsigned_long
Assimp::FBX::PropertyGet<unsigned_long>(PropertyTable *in,string *name,unsigned_long *defaultValue)

{
  Property *this;
  TypedProperty<unsigned_long> *this_00;
  unsigned_long *puVar1;
  TypedProperty<unsigned_long> *tprop;
  Property *prop;
  unsigned_long *defaultValue_local;
  string *name_local;
  PropertyTable *in_local;
  
  this = PropertyTable::Get(in,name);
  if (this == (Property *)0x0) {
    in_local = (PropertyTable *)*defaultValue;
  }
  else {
    this_00 = Property::As<Assimp::FBX::TypedProperty<unsigned_long>>(this);
    if (this_00 == (TypedProperty<unsigned_long> *)0x0) {
      in_local = (PropertyTable *)*defaultValue;
    }
    else {
      puVar1 = TypedProperty<unsigned_long>::Value(this_00);
      in_local = (PropertyTable *)*puVar1;
    }
  }
  return (unsigned_long)in_local;
}

Assistant:

inline 
T PropertyGet(const PropertyTable& in, const std::string& name, const T& defaultValue) {
    const Property* const prop = in.Get(name);
    if( nullptr == prop) {
        return defaultValue;
    }

    // strong typing, no need to be lenient
    const TypedProperty<T>* const tprop = prop->As< TypedProperty<T> >();
    if( nullptr == tprop) {
        return defaultValue;
    }

    return tprop->Value();
}